

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableDeathTest_ResizeOverflow_Test::TestBody(HashtableDeathTest_ResizeOverflow_Test *this)

{
  undefined1 uVar1;
  bool bVar2;
  length_error *anon_var_0_1;
  type e_1;
  bool gtest_caught_expected_1;
  TrueWithString gtest_msg_1;
  sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ht2;
  length_error *anon_var_0;
  type e;
  bool gtest_caught_expected;
  TrueWithString gtest_msg;
  dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ht;
  undefined7 in_stack_fffffffffffffe18;
  undefined1 in_stack_fffffffffffffe1f;
  allocator_type *in_stack_fffffffffffffe20;
  sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  *this_00;
  undefined7 in_stack_fffffffffffffe28;
  undefined1 in_stack_fffffffffffffe2f;
  undefined7 in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe37;
  size_type in_stack_fffffffffffffe38;
  string *this_01;
  int line;
  undefined7 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe47;
  libc_allocator_with_realloc<std::pair<const_int,_int>_> *this_02;
  Type type;
  AssertHelper *in_stack_fffffffffffffe50;
  Message *in_stack_fffffffffffffe98;
  Message *message;
  AssertHelper *in_stack_fffffffffffffea0;
  AssertHelper *this_03;
  libc_allocator_with_realloc<std::pair<const_int,_int>_> local_13b [162];
  byte local_99;
  string local_98;
  libc_allocator_with_realloc<std::pair<const_int,_int>_> local_5b [91];
  
  this_02 = local_5b;
  google::libc_allocator_with_realloc<std::pair<const_int,_int>_>::libc_allocator_with_realloc
            (this_02);
  type = (Type)((ulong)this_02 >> 0x20);
  google::
  dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::dense_hash_map((dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                    *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                   in_stack_fffffffffffffe38,
                   (hasher *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
                   (key_equal *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
                   in_stack_fffffffffffffe20);
  google::libc_allocator_with_realloc<std::pair<const_int,_int>_>::~libc_allocator_with_realloc
            (local_5b);
  local_98.field_2._M_allocated_capacity = 0;
  local_98.field_2._8_8_ = 0;
  local_98._M_dataplus = (_Alloc_hider)0x0;
  local_98._1_7_ = 0;
  local_98._M_string_length = 0;
  this_01 = &local_98;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)0x9e634b);
  uVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)this_01);
  if ((bool)uVar1) {
    local_99 = 0;
    in_stack_fffffffffffffe37 = testing::internal::AlwaysTrue();
    if ((bool)in_stack_fffffffffffffe37) {
      google::
      dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
      ::resize((dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                *)in_stack_fffffffffffffe20,
               CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18));
    }
    if ((local_99 & 1) != 0) goto LAB_009e66a2;
    std::__cxx11::string::operator=
              ((string *)&local_98,
               "Expected: ht.resize(static_cast<size_t>(-1)) throws an exception of type std::length_error.\n  Actual: it throws nothing."
              );
  }
  testing::Message::Message((Message *)in_stack_fffffffffffffe50);
  std::__cxx11::string::c_str();
  testing::internal::AssertHelper::AssertHelper
            (in_stack_fffffffffffffe50,type,(char *)CONCAT17(uVar1,in_stack_fffffffffffffe40),
             (int)((ulong)this_01 >> 0x20),
             (char *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30));
  testing::internal::AssertHelper::operator=(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe20);
  testing::Message::~Message((Message *)0x9e6657);
LAB_009e66a2:
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)0x9e66af);
  google::libc_allocator_with_realloc<std::pair<const_int,_int>_>::libc_allocator_with_realloc
            (local_13b);
  google::
  sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::sparse_hash_map((sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                     *)CONCAT17(uVar1,in_stack_fffffffffffffe40),(size_type)this_01,
                    (hasher *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
                    (key_equal *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
                    in_stack_fffffffffffffe20);
  line = (int)((ulong)this_01 >> 0x20);
  google::libc_allocator_with_realloc<std::pair<const_int,_int>_>::~libc_allocator_with_realloc
            (local_13b);
  message = (Message *)0x0;
  this_03 = (AssertHelper *)0x0;
  this_00 = (sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
             *)&stack0xfffffffffffffe98;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)0x9e671b);
  bVar2 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)this_00);
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      google::
      sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
      ::resize(this_00,CONCAT17(bVar2,in_stack_fffffffffffffe18));
    }
    std::__cxx11::string::operator=
              ((string *)&stack0xfffffffffffffe98,
               "Expected: ht2.resize(static_cast<size_t>(-1)) throws an exception of type std::length_error.\n  Actual: it throws nothing."
              );
  }
  testing::Message::Message((Message *)in_stack_fffffffffffffe50);
  std::__cxx11::string::c_str();
  testing::internal::AssertHelper::AssertHelper
            (in_stack_fffffffffffffe50,type,(char *)CONCAT17(uVar1,in_stack_fffffffffffffe40),line,
             (char *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30));
  testing::internal::AssertHelper::operator=(this_03,message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
  testing::Message::~Message((Message *)0x9e6a1d);
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)0x9e6a6c);
  google::
  sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::~sparse_hash_map((sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                      *)0x9e6a79);
  google::
  dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::~dense_hash_map((dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                     *)0x9e6a86);
  return;
}

Assistant:

TEST(HashtableDeathTest, ResizeOverflow) {
  dense_hash_map<int, int> ht;
  EXPECT_THROW(ht.resize(static_cast<size_t>(-1)), std::length_error);

  sparse_hash_map<int, int> ht2;
  EXPECT_THROW(ht2.resize(static_cast<size_t>(-1)), std::length_error);
}